

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O1

void google::protobuf::compiler::cpp::ListAllTypesForServices
               (FileDescriptor *fd,
               vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
               *types)

{
  pointer *pppDVar1;
  iterator iVar2;
  long lVar3;
  MethodDescriptor *this;
  long lVar4;
  long lVar5;
  long lVar6;
  Descriptor *local_40;
  FileDescriptor *local_38;
  
  if (0 < *(int *)(fd + 0x34)) {
    lVar4 = 0;
    local_38 = fd;
    do {
      if (0 < *(int *)(*(long *)(local_38 + 0x68) + 0x28 + lVar4 * 0x30)) {
        lVar3 = *(long *)(local_38 + 0x68) + lVar4 * 0x30;
        lVar5 = 0;
        lVar6 = 0;
        do {
          this = (MethodDescriptor *)(*(long *)(lVar3 + 0x20) + lVar5);
          local_40 = MethodDescriptor::input_type(this);
          iVar2._M_current =
               (types->
               super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
               )._M_impl.super__Vector_impl_data._M_finish;
          if (iVar2._M_current ==
              (types->
              super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
              )._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>
            ::_M_realloc_insert<google::protobuf::Descriptor_const*>
                      ((vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>
                        *)types,iVar2,&local_40);
          }
          else {
            *iVar2._M_current = local_40;
            pppDVar1 = &(types->
                        super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                        )._M_impl.super__Vector_impl_data._M_finish;
            *pppDVar1 = *pppDVar1 + 1;
          }
          local_40 = MethodDescriptor::output_type(this);
          iVar2._M_current =
               (types->
               super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
               )._M_impl.super__Vector_impl_data._M_finish;
          if (iVar2._M_current ==
              (types->
              super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
              )._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>
            ::_M_realloc_insert<google::protobuf::Descriptor_const*>
                      ((vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>
                        *)types,iVar2,&local_40);
          }
          else {
            *iVar2._M_current = local_40;
            pppDVar1 = &(types->
                        super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                        )._M_impl.super__Vector_impl_data._M_finish;
            *pppDVar1 = *pppDVar1 + 1;
          }
          lVar6 = lVar6 + 1;
          lVar5 = lVar5 + 0x40;
        } while (lVar6 < *(int *)(lVar3 + 0x28));
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < *(int *)(local_38 + 0x34));
  }
  return;
}

Assistant:

void ListAllTypesForServices(const FileDescriptor* fd,
                             std::vector<const Descriptor*>* types) {
  for (int i = 0; i < fd->service_count(); i++) {
    const ServiceDescriptor* sd = fd->service(i);
    for (int j = 0; j < sd->method_count(); j++) {
      const MethodDescriptor* method = sd->method(j);
      types->push_back(method->input_type());
      types->push_back(method->output_type());
    }
  }
}